

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testConstructNoHandler_Test::~Engine_testConstructNoHandler_Test
          (Engine_testConstructNoHandler_Test *this)

{
  void *in_RDI;
  
  ~Engine_testConstructNoHandler_Test((Engine_testConstructNoHandler_Test *)0x130018);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testConstructNoHandler) {
    Engine e("foo");
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(0, e.GetHandlers().size());
    Engine e1(std::string("bar"));
    ASSERT_EQ("bar", e1.prefix);
    ASSERT_EQ(0, e1.GetHandlers().size());
}